

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

int Abc_NtkCleanupSeq(Abc_Ntk_t *pNtk,int fLatchSweep,int fAutoSweep,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    pVVar3 = Abc_NtkDfsSeq(pNtk);
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    if (pVVar3 != (Vec_Ptr_t *)0x0) {
      free(pVVar3);
    }
    uVar1 = Abc_NodeRemoveNonCurrentObjects(pNtk);
    if (fVerbose != 0) {
      printf("Cleanup removed %4d dangling objects.\n",(ulong)uVar1);
    }
    if (fLatchSweep != 0) {
      uVar1 = Abc_NtkLatchSweep(pNtk);
      if (fVerbose != 0) {
        printf("Cleanup removed %4d redundant latches.\n",(ulong)uVar1);
      }
    }
    if (fAutoSweep != 0) {
      pVVar3 = Abc_NtkDfsSeqReverse(pNtk);
      if (pVVar3->pArray != (void **)0x0) {
        free(pVVar3->pArray);
        pVVar3->pArray = (void **)0x0;
      }
      if (pVVar3 != (Vec_Ptr_t *)0x0) {
        free(pVVar3);
      }
      uVar1 = Abc_NtkReplaceAutonomousLogic(pNtk);
      if (fVerbose != 0) {
        printf("Cleanup added   %4d additional PIs.\n",(ulong)uVar1);
      }
      uVar1 = Abc_NodeRemoveNonCurrentObjects(pNtk);
      if (fVerbose != 0) {
        printf("Cleanup removed %4d autonomous objects.\n",(ulong)uVar1);
      }
    }
    iVar2 = Abc_NtkCheck(pNtk);
    if (iVar2 == 0) {
      puts("Abc_NtkCleanupSeq: The network check has failed.");
    }
    return 1;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                ,0x39b,"int Abc_NtkCleanupSeq(Abc_Ntk_t *, int, int, int)");
}

Assistant:

int Abc_NtkCleanupSeq( Abc_Ntk_t * pNtk, int fLatchSweep, int fAutoSweep, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    int Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // mark the nodes reachable from the POs
    vNodes = Abc_NtkDfsSeq( pNtk );
    Vec_PtrFree( vNodes );
    // remove the non-marked nodes
    Counter = Abc_NodeRemoveNonCurrentObjects( pNtk );
    if ( fVerbose )
        printf( "Cleanup removed %4d dangling objects.\n", Counter );
    // check if some of the latches can be removed
    if ( fLatchSweep )
    {
        Counter = Abc_NtkLatchSweep( pNtk );
        if ( fVerbose )
            printf( "Cleanup removed %4d redundant latches.\n", Counter );
    }
    // detect the autonomous components
    if ( fAutoSweep )
    {
        vNodes = Abc_NtkDfsSeqReverse( pNtk );
        Vec_PtrFree( vNodes );
        // replace them by PIs
        Counter = Abc_NtkReplaceAutonomousLogic( pNtk );
        if ( fVerbose )
            printf( "Cleanup added   %4d additional PIs.\n", Counter );
        // remove the non-marked nodes
        Counter = Abc_NodeRemoveNonCurrentObjects( pNtk );
        if ( fVerbose )
            printf( "Cleanup removed %4d autonomous objects.\n", Counter );
    }
    // check
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Abc_NtkCleanupSeq: The network check has failed.\n" );
    return 1;
}